

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O1

int kuznyechik_wrap_init(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  
  puVar8 = (undefined8 *)EVP_CIPHER_CTX_get_cipher_data();
  puVar8[9] = 0;
  puVar8[10] = 0;
  puVar8[0xb] = 0;
  puVar8[0xc] = 0;
  puVar8[0xd] = 0;
  puVar8[0xe] = 0;
  puVar8[0xf] = 0;
  if (iv != (uchar *)0x0) {
    *puVar8 = 0;
    *puVar8 = *(undefined8 *)iv;
  }
  if (key != (uchar *)0x0) {
    uVar1 = *(undefined8 *)key;
    uVar2 = *(undefined8 *)(key + 8);
    uVar3 = *(undefined8 *)(key + 0x10);
    uVar4 = *(undefined8 *)(key + 0x18);
    uVar5 = *(undefined8 *)(key + 0x20);
    uVar6 = *(undefined8 *)(key + 0x28);
    uVar7 = *(undefined8 *)(key + 0x38);
    puVar8[7] = *(undefined8 *)(key + 0x30);
    puVar8[8] = uVar7;
    puVar8[5] = uVar5;
    puVar8[6] = uVar6;
    puVar8[3] = uVar3;
    puVar8[4] = uVar4;
    puVar8[1] = uVar1;
    puVar8[2] = uVar2;
  }
  return 1;
}

Assistant:

static int kuznyechik_wrap_init(EVP_CIPHER_CTX *ctx, const unsigned char *key,
	const unsigned char *iv, int enc)
{
	GOST_WRAP_CTX *cctx = EVP_CIPHER_CTX_get_cipher_data(ctx);
	memset(cctx->wrapped, 0, KUZNYECHIK_WRAPPED_KEY_LEN);
	cctx->wrap_count = 0;

	if (iv) {
		memset(cctx->iv, 0, 8);
		memcpy(cctx->iv, iv, 8);
	}

	if (key) {
		memcpy(cctx->key, key, GOSTKEYLEN*2);
	}
	return 1;
}